

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_release_memory(sqlite3 *db)

{
  Btree *p;
  Pager *pPager_00;
  Pager *pPager;
  Btree *pBt;
  int i;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for (pBt._4_4_ = 0; pBt._4_4_ < db->nDb; pBt._4_4_ = pBt._4_4_ + 1) {
    p = db->aDb[pBt._4_4_].pBt;
    if (p != (Btree *)0x0) {
      pPager_00 = sqlite3BtreePager(p);
      sqlite3PagerShrink(pPager_00);
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_db_release_memory(sqlite3 *db){
  int i;
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      Pager *pPager = sqlite3BtreePager(pBt);
      sqlite3PagerShrink(pPager);
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}